

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *this,
          void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  WaitScope *in_RDX;
  undefined4 *puVar12;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> result;
  ExceptionOrValue local_1c8;
  char local_68;
  undefined4 local_60 [12];
  Disposer *local_30;
  PromiseNode *local_28;
  
  local_1c8.exception.ptr.isSet = false;
  local_68 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1c8,in_RDX);
  puVar12 = (undefined4 *)0x0;
  if (local_68 != '\0') {
    puVar12 = local_60;
  }
  if (local_68 != '\x01') {
    if (local_1c8.exception.ptr.isSet == false) {
      kj::_::unreachable();
    }
    throwFatalException(&local_1c8.exception.ptr.field_1.value,0);
  }
  exception = &local_1c8.exception.ptr.field_1;
  if (local_1c8.exception.ptr.isSet != false) {
    throwRecoverableException(&exception->value,0);
  }
  uVar1 = *puVar12;
  uVar2 = puVar12[1];
  uVar3 = puVar12[2];
  uVar4 = puVar12[3];
  uVar5 = puVar12[4];
  uVar6 = puVar12[5];
  uVar7 = puVar12[6];
  uVar8 = puVar12[7];
  uVar9 = puVar12[9];
  uVar10 = puVar12[10];
  uVar11 = puVar12[0xb];
  *(undefined4 *)&this[2].super_PromiseBase.node.disposer = puVar12[8];
  *(undefined4 *)((long)&this[2].super_PromiseBase.node.disposer + 4) = uVar9;
  *(undefined4 *)&this[2].super_PromiseBase.node.ptr = uVar10;
  *(undefined4 *)((long)&this[2].super_PromiseBase.node.ptr + 4) = uVar11;
  *(undefined4 *)&this[1].super_PromiseBase.node.disposer = uVar5;
  *(undefined4 *)((long)&this[1].super_PromiseBase.node.disposer + 4) = uVar6;
  *(undefined4 *)&this[1].super_PromiseBase.node.ptr = uVar7;
  *(undefined4 *)((long)&this[1].super_PromiseBase.node.ptr + 4) = uVar8;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = uVar1;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uVar2;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar3;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar4;
  this[3].super_PromiseBase.node.disposer = local_30;
  this[3].super_PromiseBase.node.ptr = local_28;
  local_28 = (PromiseNode *)0x0;
  if (local_1c8.exception.ptr.isSet == true) {
    Exception::~Exception(&exception->value);
  }
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }